

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SC.cpp
# Opt level: O0

void __thiscall
OpenMD::SC::addExplicitInteraction
          (SC *this,AtomType *atype1,AtomType *atype2,RealType epsilon,RealType m,RealType n,
          RealType alpha)

{
  int iVar1;
  int iVar2;
  CubicSpline *this_00;
  vector<double,_std::allocator<double>_> *yps;
  vector<double,_std::allocator<double>_> *pvVar3;
  reference pvVar4;
  vector<int,_std::allocator<int>_> *this_01;
  reference pvVar5;
  reference pvVar6;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  double dVar7;
  double dVar8;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  int sctid2;
  int sctid1;
  CubicSpline *phi;
  CubicSpline *V;
  RealType r;
  int k;
  vector<double,_std::allocator<double>_> phivals;
  vector<double,_std::allocator<double>_> vvals;
  vector<double,_std::allocator<double>_> rvals;
  RealType dr;
  SCInteractionData mixer;
  value_type_conflict1 *in_stack_fffffffffffffe78;
  CubicSpline *in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe90;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffea0;
  CubicSpline *this_02;
  int local_fc;
  double local_80;
  vector<double,_std::allocator<double>_> *local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  CubicSpline *local_50;
  vector<double,_std::allocator<double>_> *local_48;
  undefined1 local_40;
  double local_38;
  double local_30;
  double local_28;
  vector<double,_std::allocator<double>_> *local_20;
  AtomType *local_18;
  AtomType *local_10;
  
  local_38 = in_XMM3_Qa;
  local_30 = in_XMM2_Qa;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  addType((SC *)phi,_sctid2);
  addType((SC *)phi,_sctid2);
  local_78 = local_20;
  local_70 = local_28;
  local_68 = local_30;
  local_80 = local_38;
  local_60 = local_38 + local_38;
  dVar7 = local_60 / (double)(*(int *)(in_RDI + 0xe8) + -1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x311e66);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x311e73);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x311e80);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  std::vector<double,_std::allocator<double>_>::push_back
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
             in_stack_fffffffffffffe78);
  for (local_fc = 1; local_fc < *(int *)(in_RDI + 0xe8); local_fc = local_fc + 1) {
    dVar8 = dVar7 * (double)local_fc;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffe90,
               (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
              );
    pow(local_80 / dVar8,local_68);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
    pow(local_80 / dVar8,local_70);
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe80,
               in_stack_fffffffffffffe78);
  }
  pvVar3 = local_78;
  local_58 = pow(local_80 / local_60,local_68);
  local_58 = (double)pvVar3 * local_58;
  this_00 = (CubicSpline *)operator_new(0xa0);
  CubicSpline::CubicSpline(in_stack_fffffffffffffe80);
  this_02 = this_00;
  CubicSpline::addPoints(this_00,pvVar3,in_stack_fffffffffffffea0);
  yps = (vector<double,_std::allocator<double>_> *)operator_new(0xa0);
  CubicSpline::CubicSpline(in_stack_fffffffffffffe80);
  CubicSpline::addPoints(this_02,pvVar3,yps);
  local_40 = 1;
  pvVar3 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x60);
  local_50 = this_00;
  local_48 = yps;
  iVar1 = AtomType::getIdent(local_10);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)pvVar3,(long)iVar1);
  iVar1 = *pvVar4;
  this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0x60);
  iVar2 = AtomType::getIdent(local_18);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)iVar2);
  iVar2 = *pvVar4;
  pvVar5 = std::
           vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                         *)(in_RDI + 0x90),(long)iVar1);
  pvVar6 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
           operator[](pvVar5,(long)iVar2);
  memcpy(pvVar6,&local_80,0x48);
  if (iVar2 != iVar1) {
    pvVar5 = std::
             vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>,_std::allocator<std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>_>_>
                           *)(in_RDI + 0x90),(long)iVar2);
    pvVar6 = std::vector<OpenMD::SCInteractionData,_std::allocator<OpenMD::SCInteractionData>_>::
             operator[](pvVar5,(long)iVar1);
    memcpy(pvVar6,&local_80,0x48);
  }
  std::vector<double,_std::allocator<double>_>::~vector(pvVar3);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar3);
  std::vector<double,_std::allocator<double>_>::~vector(pvVar3);
  return;
}

Assistant:

void SC::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                  RealType epsilon, RealType m, RealType n,
                                  RealType alpha) {
    // in case these weren't already in the map
    addType(atype1);
    addType(atype2);

    SCInteractionData mixer;

    mixer.epsilon = epsilon;
    mixer.m       = m;
    mixer.n       = n;
    mixer.alpha   = alpha;
    mixer.rCut    = 2.0 * mixer.alpha;

    RealType dr = mixer.rCut / (np_ - 1);
    vector<RealType> rvals;
    vector<RealType> vvals;
    vector<RealType> phivals;

    rvals.push_back(0.0);
    vvals.push_back(0.0);
    phivals.push_back(0.0);

    for (int k = 1; k < np_; k++) {
      RealType r = dr * k;
      rvals.push_back(r);
      vvals.push_back(mixer.epsilon * pow(mixer.alpha / r, mixer.n));
      phivals.push_back(pow(mixer.alpha / r, mixer.m));
    }

    mixer.vCut = mixer.epsilon * pow(mixer.alpha / mixer.rCut, mixer.n);

    CubicSpline* V = new CubicSpline();
    V->addPoints(rvals, vvals);

    CubicSpline* phi = new CubicSpline();
    phi->addPoints(rvals, phivals);

    mixer.V   = V;
    mixer.phi = phi;

    mixer.explicitlySet = true;

    int sctid1 = SCtids[atype1->getIdent()];
    int sctid2 = SCtids[atype2->getIdent()];

    MixingMap[sctid1][sctid2] = mixer;
    if (sctid2 != sctid1) { MixingMap[sctid2][sctid1] = mixer; }
    return;
  }